

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover_cpu.cxx
# Opt level: O2

Mat * __thiscall
FlickerRemoverCPU::removeFlickering
          (FlickerRemoverCPU *this,Mat *frame,double timestamp,string *error)

{
  double dVar1;
  char cVar2;
  Mat *pMVar3;
  _InputArray *p_Var4;
  BooleanArray2D *pBVar5;
  BooleanArray2D *pBVar6;
  ulong uVar7;
  undefined8 uVar8;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  BooleanArray2D *local_198;
  BooleanArray2D *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  Mat *frame_copy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if ((*(int *)(frame + 8) != this->frame_rows) || (*(int *)(frame + 0xc) != this->frame_cols)) {
    std::__cxx11::to_string(&local_48,*(int *)(frame + 0xc));
    std::operator+(&local_a8,"Flickering cannot be removed. Size of the frame: ",&local_48);
    std::operator+(&local_88,&local_a8,"x");
    std::__cxx11::to_string(&local_c8,*(int *)(frame + 8));
    std::operator+(&local_68,&local_88,&local_c8);
    std::operator+(&local_128,&local_68," is different than expected: ");
    std::__cxx11::to_string(&local_e8,this->frame_cols);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frame_copy,
                   &local_128,&local_e8);
    std::operator+(&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frame_copy,
                   "x");
    std::__cxx11::to_string(&local_108,this->frame_rows);
    std::operator+(&local_188,&local_148,&local_108);
    std::operator+(&local_1b8,&local_188,".");
    std::__cxx11::string::operator=((string *)error,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&frame_copy);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_48;
LAB_00113a97:
    std::__cxx11::string::~string((string *)this_00);
    return (Mat *)0x0;
  }
  dVar1 = this->expected_timestamp;
  if (((dVar1 != -1.0) || (NAN(dVar1))) &&
     (this->accepted_timestamp_difference <= ABS(dVar1 - timestamp))) {
    if (timestamp < dVar1) {
      std::__cxx11::to_string((string *)&frame_copy,timestamp);
      std::operator+(&local_148,"Received unexpected timestamp: ",(string *)&frame_copy);
      std::operator+(&local_188,&local_148," Expected value close to: ");
      std::__cxx11::to_string(&local_128,this->expected_timestamp);
      std::operator+(&local_1b8,&local_188,&local_128);
      std::__cxx11::string::operator=((string *)error,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_148);
      this_00 = (string *)&frame_copy;
      goto LAB_00113a97;
    }
    this->actual_mask =
         ((int)(long)(((timestamp - dVar1) + this->accepted_timestamp_difference) /
                     this->timestamps_delta) + this->actual_mask) % (this->number_of_masks + 1);
    this->expected_timestamp = timestamp;
  }
  this->expected_timestamp = timestamp + this->timestamps_delta;
  pMVar3 = (Mat *)operator_new(0x60);
  cv::Mat::Mat(pMVar3);
  frame_copy = pMVar3;
  if (this->actual_mask == this->number_of_masks) {
    this->actual_mask = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8._M_dataplus._M_p._0_4_ = 0x2010000;
    local_1b8._M_string_length = (size_type)pMVar3;
    cv::Mat::convertTo((_OutputArray *)frame,(int)&local_1b8,1.0,0.0);
  }
  else {
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8._M_dataplus._M_p._0_4_ = 0x1010000;
    local_188._M_string_length =
         (size_type)
         ((this->masks).super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
          super__Vector_impl_data._M_start + (ulong)this->actual_mask * 0x60);
    local_188.field_2._M_allocated_capacity = 0;
    local_148.field_2._M_allocated_capacity = 0;
    local_188._M_dataplus._M_p._0_4_ = 0x1010000;
    local_148._M_dataplus._M_p._0_4_ = 0x2010000;
    local_1b8._M_string_length = (size_type)frame;
    local_148._M_string_length = (size_type)pMVar3;
    p_Var4 = (_InputArray *)cv::noArray();
    cv::subtract((_InputArray *)&local_1b8,(_InputArray *)&local_188,(_OutputArray *)&local_148,
                 p_Var4,4);
    this->actual_mask = this->actual_mask + 1;
  }
  if (((this->frames_block).count_of_elements == 0) ||
     (pMVar3 = (this->frames_block).data[(this->frames_block).last_element_index],
     pMVar3 == (Mat *)0x0)) {
LAB_00113c91:
    pMVar3 = CircularBuffer<cv::Mat_*>::push(&this->frames_block,frame_copy);
    if (pMVar3 != (Mat *)0x0) {
      pBVar5 = (BooleanArray2D *)operator_new(0x10);
      BooleanArray2D::BooleanArray2D(pBVar5,this->frame_rows,this->frame_cols);
      pBVar6 = CircularBuffer<BooleanArray2D_*>::push
                         (&this->corresponding_frames_similarity_levels,pBVar5);
      cVar2 = cv::Mat::empty();
      if (cVar2 == '\0') {
        uVar7 = cv::Mat::total();
        if (uVar7 / (ulong)(long)*(int *)(*(long *)(pMVar3 + 0x40) + -4 +
                                         (long)*(int *)(pMVar3 + 4) * 4) < 0x80000000) {
          uVar7 = cv::Mat::total();
          local_188._M_dataplus._M_p._0_4_ = 0;
          local_188._M_dataplus._M_p._4_4_ =
               (undefined4)
               (uVar7 / (ulong)(long)*(int *)(*(long *)(pMVar3 + 0x40) + -4 +
                                             (long)*(int *)(pMVar3 + 4) * 4));
          local_1b8._M_dataplus._M_p = (pointer)&PTR__ParallelLoopBody_00120958;
          local_1b8.field_2._8_8_ = &frame_copy;
          local_1b8._M_string_length = (size_type)pMVar3;
          local_1b8.field_2._M_allocated_capacity = (size_type)this;
          local_198 = pBVar5;
          local_190 = pBVar6;
          cv::parallel_for_((Range *)&local_188,(ParallelLoopBody *)&local_1b8,-1.0);
          cv::ParallelLoopBody::~ParallelLoopBody((ParallelLoopBody *)&local_1b8);
          if (pBVar6 != (BooleanArray2D *)0x0) {
            BooleanArray2D::~BooleanArray2D(pBVar6);
          }
          operator_delete(pBVar6,0x10);
          goto LAB_00113d88;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"!empty()",(allocator<char> *)&local_188);
        cv::error(-0xd7,(string *)&local_1b8,"forEach_impl",
                  "/usr/include/opencv4/opencv2/core/utility.hpp",0x273);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"this->total() / this->size[this->dims - 1] <= INT_MAX",
                 (allocator<char> *)&local_188);
      cv::error(-0xd7,(string *)&local_1b8,"forEach_impl",
                "/usr/include/opencv4/opencv2/core/utility.hpp",0x274);
LAB_00113ebe:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"!empty()",(allocator<char> *)&local_188);
      cv::error(-0xd7,(string *)&local_1b8,"forEach_impl",
                "/usr/include/opencv4/opencv2/core/utility.hpp",0x273);
      goto LAB_00113ef3;
    }
LAB_00113d88:
    if ((this->actual_mask != this->number_of_masks) ||
       ((this->frames_block).count_of_elements != (this->frames_block).count_of_slots)) {
      return frame_copy;
    }
    cVar2 = cv::Mat::empty();
    if (cVar2 == '\0') {
      uVar7 = cv::Mat::total();
      if (uVar7 / (ulong)(long)*(int *)(*(long *)&this->field_0x1a0 + -4 +
                                       (long)*(int *)&this->field_0x164 * 4) < 0x80000000) {
        uVar7 = cv::Mat::total();
        local_188._M_dataplus._M_p._0_4_ = 0;
        local_188._M_dataplus._M_p._4_4_ =
             (undefined4)
             (uVar7 / (ulong)(long)*(int *)(*(long *)&this->field_0x1a0 + -4 +
                                           (long)*(int *)&this->field_0x164 * 4));
        local_1b8._M_dataplus._M_p = (pointer)&PTR__ParallelLoopBody_00120998;
        local_1b8.field_2._8_8_ = &frame_copy;
        local_1b8._M_string_length = (size_type)&this->flicker_counter;
        local_1b8.field_2._M_allocated_capacity = (size_type)this;
        cv::parallel_for_((Range *)&local_188,(ParallelLoopBody *)&local_1b8,-1.0);
        cv::ParallelLoopBody::~ParallelLoopBody((ParallelLoopBody *)&local_1b8);
        return frame_copy;
      }
      goto LAB_00113f5d;
    }
  }
  else {
    pBVar5 = (BooleanArray2D *)operator_new(0x10);
    BooleanArray2D::BooleanArray2D(pBVar5,this->frame_rows,this->frame_cols);
    pBVar6 = CircularBuffer<BooleanArray2D_*>::push(&this->adjacent_frames_similarity_levels,pBVar5)
    ;
    cVar2 = cv::Mat::empty();
    if (cVar2 != '\0') goto LAB_00113ebe;
    uVar7 = cv::Mat::total();
    if (uVar7 / (ulong)(long)*(int *)(*(long *)(pMVar3 + 0x40) + -4 + (long)*(int *)(pMVar3 + 4) * 4
                                     ) < 0x80000000) {
      uVar7 = cv::Mat::total();
      local_188._M_dataplus._M_p._0_4_ = 0;
      local_188._M_dataplus._M_p._4_4_ =
           (undefined4)
           (uVar7 / (ulong)(long)*(int *)(*(long *)(pMVar3 + 0x40) + -4 +
                                         (long)*(int *)(pMVar3 + 4) * 4));
      local_1b8._M_dataplus._M_p = (pointer)&PTR__ParallelLoopBody_00120918;
      local_1b8.field_2._8_8_ = &frame_copy;
      local_1b8._M_string_length = (size_type)pMVar3;
      local_1b8.field_2._M_allocated_capacity = (size_type)this;
      local_198 = pBVar5;
      local_190 = pBVar6;
      cv::parallel_for_((Range *)&local_188,(ParallelLoopBody *)&local_1b8,-1.0);
      cv::ParallelLoopBody::~ParallelLoopBody((ParallelLoopBody *)&local_1b8);
      if (pBVar6 != (BooleanArray2D *)0x0) {
        BooleanArray2D::~BooleanArray2D(pBVar6);
      }
      operator_delete(pBVar6,0x10);
      goto LAB_00113c91;
    }
LAB_00113ef3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"this->total() / this->size[this->dims - 1] <= INT_MAX",
               (allocator<char> *)&local_188);
    cv::error(-0xd7,(string *)&local_1b8,"forEach_impl",
              "/usr/include/opencv4/opencv2/core/utility.hpp",0x274);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"!empty()",(allocator<char> *)&local_188);
  cv::error(-0xd7,(string *)&local_1b8,"forEach_impl",
            "/usr/include/opencv4/opencv2/core/utility.hpp",0x273);
LAB_00113f5d:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"this->total() / this->size[this->dims - 1] <= INT_MAX",
             (allocator<char> *)&local_188);
  uVar8 = cv::error(-0xd7,(string *)&local_1b8,"forEach_impl",
                    "/usr/include/opencv4/opencv2/core/utility.hpp",0x274);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&frame_copy);
  _Unwind_Resume(uVar8);
}

Assistant:

Mat *FlickerRemoverCPU::removeFlickering(const Mat &frame, double timestamp, string &error)
{
    if(frame.rows != frame_rows || frame.cols != frame_cols) {
        error = "Flickering cannot be removed. Size of the frame: " + to_string(frame.cols) + "x" +
                to_string(frame.rows) + " is different than expected: " + to_string(frame_cols) + "x" +
                to_string(frame_rows) + ".";
        return nullptr;
    }
    if(!timestampIsCloseToExpectedTimestamp(timestamp)) {
        //very unlikely. Should not happen...
        if(timestamp < expected_timestamp) {
            error = "Received unexpected timestamp: " + to_string(timestamp) + " Expected value close to: " +
                    to_string(expected_timestamp);
            return nullptr;
        }
        //calculate number of frames that were dropped
        auto number_of_dropped = (unsigned int) ((timestamp - expected_timestamp + accepted_timestamp_difference) /
                                                 timestamps_delta);
        actual_mask = (actual_mask + number_of_dropped) % (number_of_masks + 1);
        expected_timestamp = timestamp;
    }
    calculateNextExpectedTimestamp(timestamp);

    auto frame_copy = new Mat();

    if(actual_mask == number_of_masks) {
        actual_mask = 0;
        frame.convertTo(*frame_copy, CV_32S);
    } else {
        subtract(frame, masks[actual_mask], *frame_copy, noArray(), CV_32S);
        actual_mask++;
    }

    auto last_frame = frames_block.last();
    if(last_frame != nullptr) {
        auto new_similarity_levels = new BooleanArray2D((unsigned int) frame_rows, (unsigned int) frame_cols);
        auto old_similarity_levels = adjacent_frames_similarity_levels.push(new_similarity_levels);

        last_frame->forEach<int>(
                [this, &frame_copy, new_similarity_levels, old_similarity_levels](int &value, const int *position) {
                    int row = position[0];
                    int col = position[1];
                    bool pixels_are_similar = similar(value, frame_copy->at<int>(row, col));
                    new_similarity_levels->set((unsigned int) row, (unsigned int) col, pixels_are_similar);
                    adjacent_frames_similarity_sum.at<unsigned char>(row, col) +=
                            (unsigned char) pixels_are_similar -
                            (unsigned char) old_similarity_levels->at((unsigned int) row, (unsigned int) col);
                });
        delete old_similarity_levels;
    }

    //push returns pointer to the allocated earlier matrix, but do not delete, since we already returned this pointer
    //outside of this method, and it is the responsibility of the caller to delete this pointer.
    auto prev_frame = frames_block.push(frame_copy);

    if(prev_frame != nullptr) {
        auto new_similarity_levels = new BooleanArray2D((unsigned int) frame_rows, (unsigned int) frame_cols);
        auto old_similarity_levels = corresponding_frames_similarity_levels.push(new_similarity_levels);
        prev_frame->forEach<int>(
                [this, &frame_copy, new_similarity_levels, old_similarity_levels](int &value, const int *position) {
                    int row = position[0];
                    int col = position[1];
                    bool pixels_are_similar = similar(value, frame_copy->at<int>(row, col));
                    new_similarity_levels->set((unsigned int) row, (unsigned int) col, pixels_are_similar);
                    corresponding_frames_similarity_sum.at<unsigned char>(row, col) +=
                            (unsigned char) pixels_are_similar -
                            (unsigned char) old_similarity_levels->at((unsigned int) row, (unsigned int) col);
                });
        delete old_similarity_levels;
    }

    if(actual_mask == number_of_masks && frames_block.isFull()) {
        flicker_counter.forEach<unsigned char>([this, &frame_copy](unsigned char &value, const int *position) {
            int row = position[0];
            int col = position[1];
            if(corresponding_frames_similarity_sum.at<unsigned char>(row, col) > 0.7 * block_size) {
                bool values_similar = true;
                unsigned int block_number = 0;
                while(values_similar && block_number + 1 < frames_block.maxSize()) {
                    values_similar = similar(frames_block[(int) block_number]->at<int>(row, col),
                                             frames_block[(int) block_number + 1]->at<int>(row, col));
                    block_number++;
                }
                if(!values_similar) {
                    value++;
                } else {
                    value = 0;
                }
            } else {
                value = 0;
            }
            if(value > max_allowed_flicker_duration) {
                for(int i = 0; i < (int) number_of_masks; i++) {
                    masks[i].at<int>(row, col) +=
                            frames_block[i + 1]->at<int>(row, col) - frames_block[0]->at<int>(row, col);
                }
                value = 0;
                //subtract mask from frame copy, but be sure that result is between 0-255
                auto mask_val = masks[number_of_masks - 1].at<int>(row, col);
                auto &frame_copy_val = frame_copy->at<int>(row, col);
                if(mask_val >= 0) {
                    if(frame_copy_val >= mask_val) {
                        frame_copy_val -= mask_val;
                    } else {
                        frame_copy_val = 0;
                    }
                } else {
                    if((int) frame_copy_val - mask_val > 255) {
                        frame_copy_val = 255;
                    } else {
                        frame_copy_val -= mask_val;
                    }
                }
            }
        });
    }
    return frame_copy;
}